

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void duckdb::TypedModeFunction<duckdb::ModeStandard<long>>::
     ConstantOperation<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::ModeFunction<duckdb::ModeStandard<long>>>
               (ModeState<long,_duckdb::ModeStandard<long>_> *state,long *key,
               AggregateUnaryInput *aggr_input,idx_t count)

{
  ulong uVar1;
  Counts *pCVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  
  if (state->frequency_map == (Counts *)0x0) {
    pCVar2 = (Counts *)operator_new(0x38);
    (pCVar2->_M_h)._M_buckets = (__buckets_ptr)0x0;
    (pCVar2->_M_h)._M_bucket_count = 0;
    *(undefined8 *)&(pCVar2->_M_h)._M_rehash_policy = 0;
    (pCVar2->_M_h)._M_rehash_policy._M_next_resize = 0;
    (pCVar2->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pCVar2->_M_h)._M_element_count = 0;
    (pCVar2->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    (pCVar2->_M_h)._M_buckets = &(pCVar2->_M_h)._M_single_bucket;
    (pCVar2->_M_h)._M_bucket_count = 1;
    (pCVar2->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (pCVar2->_M_h)._M_rehash_policy._M_next_resize = 0;
    (pCVar2->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    state->frequency_map = pCVar2;
  }
  pmVar3 = ::std::__detail::
           _Map_base<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)state->frequency_map,key);
  pmVar3->count = pmVar3->count + count;
  uVar1 = state->count;
  uVar4 = pmVar3->first_row;
  if (uVar1 <= pmVar3->first_row) {
    uVar4 = uVar1;
  }
  pmVar3->first_row = uVar4;
  state->count = uVar1 + count;
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &key, AggregateUnaryInput &aggr_input, idx_t count) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(aggr_input.input.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		i.count += count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		state.count += count;
	}